

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_metadata.cpp
# Opt level: O3

shared_ptr<libtorrent::peer_plugin> __thiscall
libtorrent::anon_unknown_5::ut_metadata_plugin::new_connection
          (ut_metadata_plugin *this,peer_connection_handle *pc)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  connection_type cVar4;
  _Atomic_word _Var5;
  peer_connection_handle *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  element_type *peVar7;
  bool bVar8;
  shared_ptr<libtorrent::peer_plugin> sVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  
  cVar4 = peer_connection_handle::type(in_RDX);
  if (cVar4 == bittorrent) {
    p_Var2 = (in_RDX->m_connection).
             super___weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      peVar7 = (element_type *)0x0;
    }
    else {
      _Var5 = p_Var2->_M_use_count;
      peVar7 = (element_type *)0x0;
      do {
        if (_Var5 == 0) goto LAB_0039e4d2;
        LOCK();
        iVar1 = p_Var2->_M_use_count;
        bVar8 = _Var5 == iVar1;
        if (bVar8) {
          p_Var2->_M_use_count = _Var5 + 1;
          iVar1 = _Var5;
        }
        _Var5 = iVar1;
        UNLOCK();
      } while (!bVar8);
      if (p_Var2->_M_use_count == 0) {
        peVar7 = (element_type *)0x0;
      }
      else {
        peVar7 = (in_RDX->m_connection).
                 super___weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
      }
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
LAB_0039e4d2:
    p_Var3 = (pc->m_connection).
             super___weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x80);
    (_Stack_30._M_pi)->_M_use_count = 1;
    (_Stack_30._M_pi)->_M_weak_count = 1;
    (_Stack_30._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_004e8b88
    ;
    p_Var2 = _Stack_30._M_pi + 1;
    _Stack_30._M_pi[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    _Stack_30._M_pi[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ut_metadata_peer_plugin_004e8bd8
    ;
    _Stack_30._M_pi[2]._M_use_count = 0;
    _Stack_30._M_pi[3]._vptr__Sp_counted_base = (_func_int **)0x8000000000000000;
    _Stack_30._M_pi[3]._M_use_count = 0;
    _Stack_30._M_pi[3]._M_weak_count = 0;
    _Stack_30._M_pi[4]._vptr__Sp_counted_base = (_func_int **)0x0;
    _Stack_30._M_pi[4]._M_use_count = 0;
    _Stack_30._M_pi[4]._M_weak_count = 0;
    _Stack_30._M_pi[5]._vptr__Sp_counted_base = (_func_int **)0x0;
    _Stack_30._M_pi[5]._M_use_count = 0;
    _Stack_30._M_pi[5]._M_weak_count = 0;
    _Stack_30._M_pi[6]._vptr__Sp_counted_base = (_func_int **)0x0;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&_Stack_30._M_pi[6]._M_use_count = p_Var3;
    _Stack_30._M_pi[7]._vptr__Sp_counted_base = (_func_int **)peVar7;
    *(peer_connection_handle **)&_Stack_30._M_pi[7]._M_use_count = pc;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&_Stack_30._M_pi[1]._M_use_count = p_Var2;
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(_Stack_30._M_pi + 2),&_Stack_30);
    _Var6._M_pi = extraout_RDX_00;
  }
  else {
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    _Stack_30._M_pi._0_4_ = 0;
    _Stack_30._M_pi._4_4_ = 0;
    _Var6._M_pi = extraout_RDX;
  }
  (this->super_torrent_plugin)._vptr_torrent_plugin = (_func_int **)p_Var2;
  *(undefined4 *)&this->m_torrent = _Stack_30._M_pi._0_4_;
  *(undefined4 *)((long)&this->m_torrent + 4) = _Stack_30._M_pi._4_4_;
  sVar9.super___shared_ptr<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  sVar9.super___shared_ptr<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<libtorrent::peer_plugin>)
         sVar9.super___shared_ptr<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<peer_plugin> ut_metadata_plugin::new_connection(
		peer_connection_handle const& pc)
	{
		if (pc.type() != connection_type::bittorrent) return {};

		aux::bt_peer_connection* c = static_cast<aux::bt_peer_connection*>(pc.native_handle().get());
		return std::make_shared<ut_metadata_peer_plugin>(m_torrent, *c, *this);
	}